

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmXMLWriter.cxx
# Opt level: O0

void __thiscall cmXMLWriter::ConditionalLineBreak(cmXMLWriter *this,bool condition,size_t indent)

{
  ulong local_28;
  size_t i;
  size_t indent_local;
  bool condition_local;
  cmXMLWriter *this_local;
  
  if (condition) {
    std::operator<<(this->Output,'\n');
    for (local_28 = 0; local_28 < indent + this->Level; local_28 = local_28 + 1) {
      std::operator<<(this->Output,(string *)&this->IndentationElement);
    }
  }
  return;
}

Assistant:

void cmXMLWriter::ConditionalLineBreak(bool condition, std::size_t indent)
{
  if (condition) {
    this->Output << '\n';
    for (std::size_t i = 0; i < indent + this->Level; ++i) {
      this->Output << this->IndentationElement;
    }
  }
}